

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O3

void erase(FT_HANDLE ftHandle)

{
  int iVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Erasing... ",0xb);
  iVar1 = FT_EraseEE(ftHandle);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error in erasing device!",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    FT_Close(ftHandle);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done.",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return;
}

Assistant:

void erase(FT_HANDLE ftHandle) {
    cout << "Erasing... ";
    FT_STATUS ftStatus = FT_EraseEE(ftHandle);
    if (ftStatus != FT_OK) // Did the command execute OK?
    {
        cerr << "Error in erasing device!" << endl;
        FT_Close(ftHandle);
        return;
    }
    cout << "Done." << endl;
}